

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O1

const_iterator __thiscall
Quest_Context::UnserializeProgress(Quest_Context *this,const_iterator it,const_iterator end)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  mapped_type *pmVar4;
  char *pcVar5;
  mapped_type mVar6;
  char *pcVar7;
  bool bVar8;
  string key;
  key_type local_60;
  Quest_Context *local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
  *local_38;
  
  if (it._M_current == end._M_current) {
    return (const_iterator)it._M_current;
  }
  if (*it._M_current != '{') {
    return (const_iterator)it._M_current;
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  pcVar5 = it._M_current + 1;
  bVar8 = pcVar5 == end._M_current;
  local_40 = this;
  if (!bVar8) {
    cVar3 = *pcVar5;
    bVar1 = false;
    if (cVar3 != '}') {
      local_38 = &this->progress;
      mVar6 = 0;
      pcVar7 = it._M_current + 2;
      do {
        pcVar5 = pcVar7;
        if (bVar1) {
          if (cVar3 == ',') {
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                     ::operator[](local_38,&local_60);
            *pmVar4 = mVar6;
            bVar1 = false;
            std::__cxx11::string::_M_replace
                      ((ulong)&local_60,0,(char *)local_60._M_string_length,0x1a58fd);
            bVar2 = false;
            mVar6 = 0;
          }
          else {
            mVar6 = (short)cVar3 + mVar6 * 10 + -0x30;
LAB_0018ba25:
            bVar1 = true;
            bVar2 = true;
          }
        }
        else {
          if (cVar3 == '=') goto LAB_0018ba25;
          bVar2 = false;
          std::__cxx11::string::push_back((char)&local_60);
          bVar1 = false;
        }
        bVar8 = pcVar5 == end._M_current;
        if (bVar8) break;
        cVar3 = *pcVar5;
        pcVar7 = pcVar5 + 1;
      } while (cVar3 != '}');
      it._M_current = pcVar5 + -1;
      goto LAB_0018ba5e;
    }
  }
  bVar2 = false;
  mVar6 = 0;
LAB_0018ba5e:
  if (bVar2) {
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
             ::operator[](&local_40->progress,&local_60);
    *pmVar4 = mVar6;
  }
  pcVar7 = it._M_current + 2;
  if (bVar8) {
    pcVar7 = pcVar5;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return (const_iterator)pcVar7;
}

Assistant:

std::string::const_iterator Quest_Context::UnserializeProgress(std::string::const_iterator it, std::string::const_iterator end)
{
	if (it == end || *it != '{')
		return it;

	++it;

	std::string key;
	short value = 0;
	int state = 0;

	for (; it != end && *it != '}'; ++it)
	{
		if (state == 0) // Reading key
		{
			if (*it == '=')
			{
				state = 1;
			}
			else
			{
				key += *it;
			}
		}
		else if (state == 1) // Reading value
		{
			if (*it == ',')
			{
				this->progress[key] = value;
				key = "";
				value = 0;
				state = 0;
			}
			else
			{
				value *= 10;
				value += *it - '0';
			}
		}
	}

	if (state == 1)
		this->progress[key] = value;

	if (it != end)
		++it;

	return it;
}